

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomTwo.cpp
# Opt level: O2

string * __thiscall
WhiteRoomTwo::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,WhiteRoomTwo *this,bool longform)

{
  itemLocation iVar1;
  ItemWrapper *this_00;
  ulong uVar2;
  itemType local_1c;
  
  local_1c = POWER_CRYSTAL;
  this_00 = ItemTable::getValue((this->super_Room).table,&local_1c);
  iVar1 = ItemWrapper::getLocation(this_00);
  uVar2 = 0x48;
  if (iVar1 != BACKPACK) {
    uVar2 = (ulong)!longform << 5 | 8;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)((long)&(this->super_Room)._vptr_Room + uVar2));
  return __return_storage_ptr__;
}

Assistant:

std::string WhiteRoomTwo::getDescription(bool longform) {
    if(table->getValue(POWER_CRYSTAL)->getLocation() == BACKPACK){
        return rstate2;
    }
    else if(longform){
        return rstate0;
    }
    else {
        return rstate1;
    }
}